

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O2

void __thiscall cmUuid::cmUuid(cmUuid *this)

{
  int local_14;
  
  (this->Groups).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Groups).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Groups).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->Groups,&local_14);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->Groups,&local_14);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->Groups,&local_14);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->Groups,&local_14);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->Groups,&local_14);
  return;
}

Assistant:

cmUuid::cmUuid()
{
  Groups.push_back(4);
  Groups.push_back(2);
  Groups.push_back(2);
  Groups.push_back(2);
  Groups.push_back(6);
}